

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self,ptls_t *tls,int is_encrypt,ptls_buffer_t *dst,
                     ptls_iovec_t src)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  ptls_context_t *ppVar5;
  ptls_buffer_t *in_RCX;
  int in_EDX;
  ptls_t *in_RSI;
  size_t in_RDI;
  undefined1 (*in_R8) [32];
  size_t in_R9;
  int ret;
  st_util_session_cache_t *self;
  
  if (in_EDX == 0) {
    if (in_R9 != 0x20) {
      return 0x205;
    }
    if (*(undefined1 (*) [32])(in_RDI + 8) != *in_R8) {
      return 0x205;
    }
    iVar3 = ptls_buffer_reserve(in_RCX,in_RDI);
    if (iVar3 != 0) {
      return iVar3;
    }
    memcpy(in_RCX->base + in_RCX->off,*(void **)(in_RDI + 0x28),*(size_t *)(in_RDI + 0x30));
    in_RCX->off = *(long *)(in_RDI + 0x30) + in_RCX->off;
  }
  else {
    free(*(void **)(in_RDI + 0x28));
    pvVar4 = malloc(in_R9);
    *(void **)(in_RDI + 0x28) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      return 0x201;
    }
    ppVar5 = ptls_get_context(in_RSI);
    (*ppVar5->random_bytes)((void *)(in_RDI + 8),0x20);
    memcpy(*(void **)(in_RDI + 0x28),in_R8,in_R9);
    *(size_t *)(in_RDI + 0x30) = in_R9;
    iVar3 = ptls_buffer_reserve(in_RCX,in_RDI);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar1 = in_RCX->base;
    sVar2 = in_RCX->off;
    *(undefined8 *)(puVar1 + sVar2) = *(undefined8 *)(in_RDI + 8);
    *(undefined8 *)(puVar1 + sVar2 + 8) = *(undefined8 *)(in_RDI + 0x10);
    *(undefined8 *)(puVar1 + sVar2 + 0x10) = *(undefined8 *)(in_RDI + 0x18);
    *(undefined8 *)(puVar1 + sVar2 + 0x18) = *(undefined8 *)(in_RDI + 0x20);
    in_RCX->off = in_RCX->off + 0x20;
  }
  return 0;
}

Assistant:

static int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self, ptls_t *tls, int is_encrypt, ptls_buffer_t *dst, ptls_iovec_t src)
{
    struct st_util_session_cache_t *self = (void *)_self;
    int ret;

    if (is_encrypt) {

        /* replace the cached entry along with a newly generated session id */
        free(self->data.base);
        if ((self->data.base = malloc(src.len)) == NULL)
            return PTLS_ERROR_NO_MEMORY;

        ptls_get_context(tls)->random_bytes(self->id, sizeof(self->id));
        memcpy(self->data.base, src.base, src.len);
        self->data.len = src.len;

        /* store the session id in buffer */
        if ((ret = ptls_buffer_reserve(dst, sizeof(self->id))) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->id, sizeof(self->id));
        dst->off += sizeof(self->id);

    } else {

        /* check if session id is the one stored in cache */
        if (src.len != sizeof(self->id))
            return PTLS_ERROR_SESSION_NOT_FOUND;
        if (memcmp(self->id, src.base, sizeof(self->id)) != 0)
            return PTLS_ERROR_SESSION_NOT_FOUND;

        /* return the cached value */
        if ((ret = ptls_buffer_reserve(dst, self->data.len)) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->data.base, self->data.len);
        dst->off += self->data.len;
    }

    return 0;
}